

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.h
# Opt level: O0

void __thiscall TCLAP::StdOutput::_longUsage(StdOutput *this,CmdLineInterface *_cmd,ostream *os)

{
  Arg *pAVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  *__x;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  reference ppAVar7;
  void *this_00;
  reference ppAVar8;
  string local_1d0;
  allocator local_1a9;
  string local_1a8 [32];
  string local_188;
  _Self local_168;
  _Self local_160;
  ArgListIterator it_1;
  allocator local_149;
  string local_148;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_128;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_120;
  string local_118;
  allocator local_f1;
  string local_f0 [32];
  string local_d0;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_b0;
  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
  local_a8;
  ArgVectorIterator it;
  undefined1 local_98 [4];
  int i;
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  xorList;
  XorHandler xorHandler;
  undefined1 local_58 [8];
  string message;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> argList;
  ostream *os_local;
  CmdLineInterface *_cmd_local;
  StdOutput *this_local;
  
  iVar3 = (*_cmd->_vptr_CmdLineInterface[0xb])();
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)((long)&message.field_2 + 8),
             (list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)CONCAT44(extraout_var,iVar3));
  iVar3 = (*_cmd->_vptr_CmdLineInterface[0xe])();
  std::__cxx11::string::string((string *)local_58,(string *)CONCAT44(extraout_var_00,iVar3));
  iVar3 = (*_cmd->_vptr_CmdLineInterface[0xc])();
  XorHandler::XorHandler
            ((XorHandler *)
             &xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (XorHandler *)CONCAT44(extraout_var_01,iVar3));
  __x = XorHandler::getXorList
                  ((XorHandler *)
                   &xorList.
                    super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
            *)local_98,__x);
  for (it._M_current._4_4_ = 0; uVar4 = (ulong)it._M_current._4_4_,
      sVar5 = std::
              vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ::size((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                      *)local_98), uVar4 < sVar5; it._M_current._4_4_ = it._M_current._4_4_ + 1) {
    pvVar6 = std::
             vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                           *)local_98,(long)(int)it._M_current._4_4_);
    local_a8._M_current =
         (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin(pvVar6);
    while( true ) {
      pvVar6 = std::
               vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                             *)local_98,(long)(int)it._M_current._4_4_);
      local_b0._M_current =
           (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar6);
      bVar2 = __gnu_cxx::operator!=(&local_a8,&local_b0);
      if (!bVar2) break;
      ppAVar7 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_a8);
      pAVar1 = *ppAVar7;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_f0,"val",&local_f1);
      (*pAVar1->_vptr_Arg[9])(&local_d0,pAVar1,local_f0);
      spacePrint(this,os,&local_d0,0x4b,3,3);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string(local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      ppAVar7 = __gnu_cxx::
                __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                ::operator*(&local_a8);
      Arg::getDescription_abi_cxx11_(&local_118,*ppAVar7);
      spacePrint(this,os,&local_118,0x4b,5,0);
      std::__cxx11::string::~string((string *)&local_118);
      local_120 = __gnu_cxx::
                  __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                  ::operator+(&local_a8,1);
      pvVar6 = std::
               vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
               ::operator[]((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                             *)local_98,(long)(int)it._M_current._4_4_);
      local_128._M_current =
           (Arg **)std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end(pvVar6);
      bVar2 = __gnu_cxx::operator!=(&local_120,&local_128);
      if (bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_148,"-- OR --",&local_149);
        spacePrint(this,os,&local_148,0x4b,9,0);
        std::__cxx11::string::~string((string *)&local_148);
        std::allocator<char>::~allocator((allocator<char> *)&local_149);
      }
      it_1._M_node = (_List_node_base *)
                     __gnu_cxx::
                     __normal_iterator<TCLAP::Arg_**,_std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>
                     ::operator++(&local_a8,0);
    }
    this_00 = (void *)std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  local_160._M_node =
       (_List_node_base *)
       std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::begin
                 ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)((long)&message.field_2 + 8))
  ;
  while( true ) {
    local_168._M_node =
         (_List_node_base *)
         std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::end
                   ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)
                    ((long)&message.field_2 + 8));
    bVar2 = std::operator!=(&local_160,&local_168);
    if (!bVar2) break;
    ppAVar8 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_160);
    bVar2 = XorHandler::contains
                      ((XorHandler *)
                       &xorList.
                        super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppAVar8);
    if (!bVar2) {
      ppAVar8 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_160);
      pAVar1 = *ppAVar8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1a8,"val",&local_1a9);
      (*pAVar1->_vptr_Arg[9])(&local_188,pAVar1,local_1a8);
      spacePrint(this,os,&local_188,0x4b,3,3);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string(local_1a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
      ppAVar8 = std::_List_iterator<TCLAP::Arg_*>::operator*(&local_160);
      Arg::getDescription_abi_cxx11_(&local_1d0,*ppAVar8);
      spacePrint(this,os,&local_1d0,0x4b,5,0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
    }
    std::_List_iterator<TCLAP::Arg_*>::operator++(&local_160,0);
  }
  std::ostream::operator<<(os,std::endl<char,std::char_traits<char>>);
  spacePrint(this,os,(string *)local_58,0x4b,3,0);
  std::
  vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
  ::~vector((vector<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
             *)local_98);
  XorHandler::~XorHandler
            ((XorHandler *)
             &xorList.
              super__Vector_base<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>,_std::allocator<std::vector<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)((long)&message.field_2 + 8));
  return;
}

Assistant:

inline void 
StdOutput::_longUsage( CmdLineInterface& _cmd, 
					   std::ostream& os ) const
{
	std::list<Arg*> argList = _cmd.getArgList();
	std::string message = _cmd.getMessage();
	XorHandler xorHandler = _cmd.getXorHandler();
	std::vector< std::vector<Arg*> > xorList = xorHandler.getXorList();

	// first the xor 
	for ( int i = 0; static_cast<unsigned int>(i) < xorList.size(); i++ )
		{
			for ( ArgVectorIterator it = xorList[i].begin(); 
				  it != xorList[i].end(); 
				  it++ )
				{
					spacePrint( os, (*it)->longID(), 75, 3, 3 );
					spacePrint( os, (*it)->getDescription(), 75, 5, 0 );

					if ( it+1 != xorList[i].end() )
						spacePrint(os, "-- OR --", 75, 9, 0);
				}
			os << std::endl << std::endl;
		}

	// then the rest
	for (ArgListIterator it = argList.begin(); it != argList.end(); it++)
		if ( !xorHandler.contains( (*it) ) )
			{
				spacePrint( os, (*it)->longID(), 75, 3, 3 ); 
				spacePrint( os, (*it)->getDescription(), 75, 5, 0 ); 
				os << std::endl;
			}

	os << std::endl;

	spacePrint( os, message, 75, 3, 0 );
}